

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

size_t mp_get_nbits(mp_int *x)

{
  ulong uVar1;
  ulong uVar2;
  BignumInt indicator;
  BignumInt shifted_word;
  size_t i;
  BignumInt hibit_index;
  BignumInt hiword;
  uint64_t hiword64;
  size_t hiword_index;
  mp_int *x_local;
  
  hiword64 = 0xffffffffffffffff;
  hiword = 0xffffffffffffffff;
  hiword_index = (size_t)x;
  mp_find_highest_nonzero_word_pair(x,0,&hiword64,&hiword,(uint64_t *)0x0);
  hibit_index = hiword;
  i = 0;
  for (shifted_word = 0x20; shifted_word != 0; shifted_word = shifted_word >> 1) {
    uVar2 = hibit_index >> (sbyte)shifted_word;
    uVar1 = (long)-uVar2 >> 0x3f;
    hibit_index = (uVar2 ^ hibit_index) & uVar1 ^ hibit_index;
    i = (shifted_word & uVar1) + i;
  }
  return hiword64 * 0x40 + i + 1;
}

Assistant:

size_t mp_get_nbits(mp_int *x)
{
    /* Sentinel values in case there are no bits set at all: we
     * imagine that there's a word at position -1 (i.e. the topmost
     * fraction word) which is all 1s, because that way, we handle a
     * zero input by considering its highest set bit to be the top one
     * of that word, i.e. just below the units digit, i.e. at bit
     * index -1, i.e. so we'll return 0 on output. */
    size_t hiword_index = -(size_t)1;
    uint64_t hiword64 = ~(BignumInt)0;

    /*
     * Find the highest nonzero word and its index.
     */
    mp_find_highest_nonzero_word_pair(x, 0, &hiword_index, &hiword64, NULL);
    BignumInt hiword = hiword64; /* in case BignumInt is a narrower type */

    /*
     * Find the index of the highest set bit within hiword.
     */
    BignumInt hibit_index = 0;
    for (size_t i = (1 << (BIGNUM_INT_BITS_BITS-1)); i != 0; i >>= 1) {
        BignumInt shifted_word = hiword >> i;
        BignumInt indicator =
            (BignumInt)(-shifted_word) >> (BIGNUM_INT_BITS-1);
        hiword ^= (shifted_word ^ hiword ) & -indicator;
        hibit_index += i & -(size_t)indicator;
    }

    /*
     * Put together the result.
     */
    return (hiword_index << BIGNUM_INT_BITS_BITS) + hibit_index + 1;
}